

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc.c
# Opt level: O0

ecs_time_t ecs_time_sub(ecs_time_t t1,ecs_time_t t2)

{
  ecs_time_t eVar1;
  undefined4 local_20;
  undefined4 uStack_1c;
  ecs_time_t t2_local;
  ecs_time_t t1_local;
  ecs_time_t result;
  
  t2_local.nanosec = t1.nanosec;
  uStack_1c = t2.nanosec;
  t2_local.sec = t1.sec;
  local_20 = t2.sec;
  if (t2_local.nanosec < uStack_1c) {
    t1_local.nanosec = (t2_local.nanosec - uStack_1c) + 1000000000;
    t1_local.sec = (t2_local.sec - local_20) - 1;
  }
  else {
    t1_local.nanosec = t2_local.nanosec - uStack_1c;
    t1_local.sec = t2_local.sec - local_20;
  }
  eVar1.nanosec = t1_local.nanosec;
  eVar1.sec = t1_local.sec;
  return eVar1;
}

Assistant:

ecs_time_t ecs_time_sub(
    ecs_time_t t1,
    ecs_time_t t2)
{
    ecs_time_t result;

    if (t1.nanosec >= t2.nanosec) {
        result.nanosec = t1.nanosec - t2.nanosec;
        result.sec = t1.sec - t2.sec;
    } else {
        result.nanosec = t1.nanosec - t2.nanosec + 1000000000;
        result.sec = t1.sec - t2.sec - 1;
    }

    return result;
}